

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Stream::setState(QHttp2Stream *this,State newState)

{
  QHttp2Connection *pQVar1;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(State *)(this + 0x68) != newState) {
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
        != 0) {
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_28 = qHttp2ConnectionLog::category.name;
      pQVar1 = getConnection(this);
      QMessageLogger::debug
                (local_40,"[%p] stream %u, state changed from %d to %d",pQVar1,
                 (ulong)*(uint *)(this + 0x10),(ulong)*(uint *)(this + 0x68),(ulong)newState);
    }
    *(State *)(this + 0x68) = newState;
    stateChanged(this,newState);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Stream::setState(State newState)
{
    if (m_state == newState)
        return;
    qCDebug(qHttp2ConnectionLog, "[%p] stream %u, state changed from %d to %d", getConnection(),
            streamID(), int(m_state), int(newState));
    m_state = newState;
    emit stateChanged(newState);
}